

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_EmptyObject_Test::TestBody(Psbt_EmptyObject_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_17;
  CfdException *except_2;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  Psbt from_b64;
  AssertionResult gtest_ar_11;
  CfdException *except_1;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  Psbt obj;
  AssertionResult gtest_ar_5;
  CfdException *except;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Psbt empty_obj;
  uint32_t in_stack_fffffffffffff7e8;
  uint32_t in_stack_fffffffffffff7ec;
  Psbt *in_stack_fffffffffffff7f0;
  int *in_stack_fffffffffffff7f8;
  char *in_stack_fffffffffffff800;
  undefined7 in_stack_fffffffffffff808;
  undefined1 in_stack_fffffffffffff80f;
  AssertHelper local_6c0;
  Message local_6b8;
  string local_6b0;
  AssertionResult local_690;
  AssertHelper local_680;
  Message local_678;
  ByteData local_670;
  string local_658;
  AssertionResult local_638;
  AssertHelper local_628;
  Message local_620;
  uint32_t local_618;
  undefined4 local_614;
  AssertionResult local_610;
  AssertHelper local_600;
  Message local_5f8;
  Transaction local_5f0;
  uint32_t local_5b0;
  undefined4 local_5ac;
  AssertionResult local_5a8;
  AssertHelper local_598;
  Message local_590;
  Transaction local_588;
  int32_t local_548;
  undefined4 local_544;
  AssertionResult local_540;
  allocator local_529;
  string local_528 [32];
  Psbt local_508 [2];
  AssertHelper local_460;
  Message local_458;
  string local_450;
  AssertionResult local_430;
  AssertHelper local_420;
  Message local_418;
  ByteData local_410;
  string local_3f8;
  AssertionResult local_3d8;
  AssertHelper local_3c8;
  Message local_3c0;
  uint32_t local_3b8;
  undefined4 local_3b4;
  AssertionResult local_3b0;
  AssertHelper local_3a0;
  Message local_398;
  Transaction local_390;
  uint32_t local_350;
  undefined4 local_34c;
  AssertionResult local_348;
  AssertHelper local_338;
  Message local_330;
  Transaction local_328;
  int32_t local_2e8;
  undefined4 local_2e4;
  AssertionResult local_2e0;
  Psbt local_2d0 [2];
  AssertHelper local_228;
  Message local_220;
  string local_218;
  AssertionResult local_1f8;
  AssertHelper local_1e8;
  Message local_1e0;
  ByteData local_1d8;
  string local_1c0;
  AssertionResult local_1a0;
  AssertHelper local_190;
  Message local_188;
  uint32_t local_180;
  undefined4 local_17c;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  Transaction local_158;
  uint32_t local_118;
  undefined4 local_114;
  AssertionResult local_110;
  AssertHelper local_100;
  Message local_f8;
  Transaction local_f0;
  int32_t local_b0;
  undefined4 local_ac;
  AssertionResult local_a8 [2];
  Psbt local_88;
  
  cfd::Psbt::Psbt(in_stack_fffffffffffff7f0);
  local_ac = 2;
  cfd::core::Psbt::GetTransaction(&local_f0,&local_88);
  local_b0 = cfd::core::AbstractTransaction::GetVersion(&local_f0.super_AbstractTransaction);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
             in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_fffffffffffff7f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x295ab3);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x227,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message((Message *)0x295b16);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x295b6e);
  local_114 = 0;
  cfd::core::Psbt::GetTransaction(&local_158,&local_88);
  local_118 = cfd::core::AbstractTransaction::GetLockTime(&local_158.super_AbstractTransaction);
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
             in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(uint *)in_stack_fffffffffffff7f0,
             (type *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_fffffffffffff7f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_110);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x295c88);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x228,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message((Message *)0x295ceb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x295d43);
  local_17c = 0x13;
  local_180 = cfd::core::Psbt::GetDataSize(&local_88);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
             in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(uint *)in_stack_fffffffffffff7f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x295e0e);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x229,pcVar2);
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::Message::~Message((Message *)0x295e71);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x295ec9);
  cfd::core::Psbt::GetData(&local_1d8,&local_88);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1c0,&local_1d8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1a0,"\"70736274ff01000a0200000000000000000000\"",
             "empty_obj.GetData().GetHex().c_str()","70736274ff01000a0200000000000000000000",pcVar2)
  ;
  std::__cxx11::string::~string((string *)&local_1c0);
  cfd::core::ByteData::~ByteData((ByteData *)0x295f45);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x295ffd);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x22b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message((Message *)0x296060);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2960b8);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_218,&local_88);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1f8,"\"cHNidP8BAAoCAAAAAAAAAAAAAA==\"",
             "empty_obj.GetBase64().c_str()","cHNidP8BAAoCAAAAAAAAAAAAAA==",pcVar2);
  std::__cxx11::string::~string((string *)&local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2961a5);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x22c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    testing::Message::~Message((Message *)0x296208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x29625d);
  cfd::Psbt::~Psbt(in_stack_fffffffffffff7f0);
  cfd::Psbt::Psbt(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8);
  local_2e4 = 1;
  cfd::core::Psbt::GetTransaction(&local_328,local_2d0);
  local_2e8 = cfd::core::AbstractTransaction::GetVersion(&local_328.super_AbstractTransaction);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
             in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_fffffffffffff7f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
  if (!bVar1) {
    testing::Message::Message(&local_330);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x29658a);
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x233,pcVar2);
    testing::internal::AssertHelper::operator=(&local_338,&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    testing::Message::~Message((Message *)0x2965ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x296645);
  local_34c = 100;
  cfd::core::Psbt::GetTransaction(&local_390,local_2d0);
  local_350 = cfd::core::AbstractTransaction::GetLockTime(&local_390.super_AbstractTransaction);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
             in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(uint *)in_stack_fffffffffffff7f0);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_fffffffffffff7f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_348);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x29675a);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x234,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    testing::Message::~Message((Message *)0x2967bd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x296815);
  local_3b4 = 0x13;
  local_3b8 = cfd::core::Psbt::GetDataSize(local_2d0);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
             in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(uint *)in_stack_fffffffffffff7f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2968e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x235,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    testing::Message::~Message((Message *)0x296943);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x29699b);
  cfd::core::Psbt::GetData(&local_410,local_2d0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_3f8,&local_410);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3d8,"\"70736274ff01000a0100000000006400000000\"",
             "obj.GetData().GetHex().c_str()","70736274ff01000a0100000000006400000000",pcVar2);
  std::__cxx11::string::~string((string *)&local_3f8);
  cfd::core::ByteData::~ByteData((ByteData *)0x296a17);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x296acf);
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x237,pcVar2);
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    testing::Message::~Message((Message *)0x296b32);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x296b8a);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_450,local_2d0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_430,"\"cHNidP8BAAoBAAAAAABkAAAAAA==\"","obj.GetBase64().c_str()",
             "cHNidP8BAAoBAAAAAABkAAAAAA==",pcVar2);
  std::__cxx11::string::~string((string *)&local_450);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_430);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x296c77);
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x238,pcVar2);
    testing::internal::AssertHelper::operator=(&local_460,&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    testing::Message::~Message((Message *)0x296cda);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x296d2f);
  cfd::Psbt::~Psbt(in_stack_fffffffffffff7f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_528,"cHNidP8BAAoBAAAAAABkAAAAAA==",&local_529);
  cfd::Psbt::Psbt(in_stack_fffffffffffff7f0,
                  (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  local_544 = 1;
  cfd::core::Psbt::GetTransaction(&local_588,local_508);
  local_548 = cfd::core::AbstractTransaction::GetVersion(&local_588.super_AbstractTransaction);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
             in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_fffffffffffff7f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_540);
  if (!bVar1) {
    testing::Message::Message(&local_590);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2970b9);
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x23f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_598,&local_590);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    testing::Message::~Message((Message *)0x297116);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x29716e);
  local_5ac = 100;
  cfd::core::Psbt::GetTransaction(&local_5f0,local_508);
  local_5b0 = cfd::core::AbstractTransaction::GetLockTime(&local_5f0.super_AbstractTransaction);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
             in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(uint *)in_stack_fffffffffffff7f0);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_fffffffffffff7f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5a8);
  if (!bVar1) {
    testing::Message::Message(&local_5f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x297277);
    testing::internal::AssertHelper::AssertHelper
              (&local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x240,pcVar2);
    testing::internal::AssertHelper::operator=(&local_600,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper(&local_600);
    testing::Message::~Message((Message *)0x2972d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x29732c);
  local_614 = 0x13;
  local_618 = cfd::core::Psbt::GetDataSize(local_508);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
             in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(uint *)in_stack_fffffffffffff7f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_610);
  if (!bVar1) {
    testing::Message::Message(&local_620);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2973eb);
    testing::internal::AssertHelper::AssertHelper
              (&local_628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x241,pcVar2);
    testing::internal::AssertHelper::operator=(&local_628,&local_620);
    testing::internal::AssertHelper::~AssertHelper(&local_628);
    testing::Message::~Message((Message *)0x297448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2974a0);
  cfd::core::Psbt::GetData(&local_670,local_508);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_658,&local_670);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_638,"\"70736274ff01000a0100000000006400000000\"",
             "from_b64.GetData().GetHex().c_str()","70736274ff01000a0100000000006400000000",pcVar2);
  std::__cxx11::string::~string((string *)&local_658);
  cfd::core::ByteData::~ByteData((ByteData *)0x29751c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_638);
  if (!bVar1) {
    testing::Message::Message(&local_678);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2975ce);
    testing::internal::AssertHelper::AssertHelper
              (&local_680,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x243,pcVar2);
    testing::internal::AssertHelper::operator=(&local_680,&local_678);
    testing::internal::AssertHelper::~AssertHelper(&local_680);
    testing::Message::~Message((Message *)0x29762b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x297683);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_6b0,local_508);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_690,"\"cHNidP8BAAoBAAAAAABkAAAAAA==\"",
             "from_b64.GetBase64().c_str()","cHNidP8BAAoBAAAAAABkAAAAAA==",pcVar2);
  std::__cxx11::string::~string((string *)&local_6b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_690);
  if (!bVar1) {
    testing::Message::Message(&local_6b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x29776a);
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x244,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    testing::Message::~Message((Message *)0x2977c7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x29781c);
  cfd::Psbt::~Psbt(in_stack_fffffffffffff7f0);
  return;
}

Assistant:

TEST(Psbt, EmptyObject) {
  try {
    Psbt empty_obj;
    EXPECT_EQ(2, empty_obj.GetTransaction().GetVersion());
    EXPECT_EQ(0, empty_obj.GetTransaction().GetLockTime());
    EXPECT_EQ(19, empty_obj.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0200000000000000000000",
        empty_obj.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoCAAAAAAAAAAAAAA==", empty_obj.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    Psbt obj(1, 100);
    EXPECT_EQ(1, obj.GetTransaction().GetVersion());
    EXPECT_EQ(100, obj.GetTransaction().GetLockTime());
    EXPECT_EQ(19, obj.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0100000000006400000000",
        obj.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoBAAAAAABkAAAAAA==", obj.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    Psbt from_b64("cHNidP8BAAoBAAAAAABkAAAAAA==");
    EXPECT_EQ(1, from_b64.GetTransaction().GetVersion());
    EXPECT_EQ(100, from_b64.GetTransaction().GetLockTime());
    EXPECT_EQ(19, from_b64.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0100000000006400000000",
        from_b64.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoBAAAAAABkAAAAAA==", from_b64.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}